

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_config_avoid_method(event_config *cfg,char *method)

{
  event_config_entry **ppeVar1;
  event_config_entry *ptr;
  char *pcVar2;
  int iVar3;
  
  ptr = (event_config_entry *)event_mm_malloc_(0x18);
  iVar3 = -1;
  if (ptr != (event_config_entry *)0x0) {
    pcVar2 = event_mm_strdup_(method);
    ptr->avoid_method = pcVar2;
    if (pcVar2 == (char *)0x0) {
      event_mm_free_(ptr);
    }
    else {
      (ptr->next).tqe_next = (event_config_entry *)0x0;
      ppeVar1 = (cfg->entries).tqh_last;
      (ptr->next).tqe_prev = ppeVar1;
      *ppeVar1 = ptr;
      (cfg->entries).tqh_last = (event_config_entry **)ptr;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
event_config_avoid_method(struct event_config *cfg, const char *method)
{
	struct event_config_entry *entry = mm_malloc(sizeof(*entry));
	if (entry == NULL)
		return (-1);

	if ((entry->avoid_method = mm_strdup(method)) == NULL) {
		mm_free(entry);
		return (-1);
	}

	TAILQ_INSERT_TAIL(&cfg->entries, entry, next);

	return (0);
}